

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall server_queue::cleanup_pending_task(server_queue *this,int id_target)

{
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_b8;
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_98;
  iterator local_70;
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_50;
  
  local_98._M_cur =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_98._M_first =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_98._M_last =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_98._M_node =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_b8._M_cur =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_b8._M_first =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_b8._M_last =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_b8._M_node =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  std::
  __remove_if<std::_Deque_iterator<server_task,server_task&,server_task*>,__gnu_cxx::__ops::_Iter_pred<server_queue::cleanup_pending_task(int)::_lambda(server_task_const&)_1_>>
            (&local_50,&local_98,&local_b8,
             (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_examples_server_server_cpp:1696:24)>
              )id_target);
  local_b8._M_cur =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_b8._M_node =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  local_98._M_cur = local_50._M_cur;
  local_98._M_first = *local_50._M_node;
  local_98._M_last = local_98._M_first + 1;
  local_98._M_node = local_50._M_node;
  local_b8._M_first = *local_b8._M_node;
  local_b8._M_last = local_b8._M_first + 1;
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::_M_erase
            (&local_70,&this->queue_tasks,&local_98,&local_b8);
  local_98._M_cur =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_98._M_first =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_start._M_first;
  local_98._M_last =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_start._M_last;
  local_98._M_node =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_start._M_node;
  local_b8._M_cur =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_b8._M_first =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_first;
  local_b8._M_last =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_last;
  local_b8._M_node =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  __remove_if<std::_Deque_iterator<server_task,server_task&,server_task*>,__gnu_cxx::__ops::_Iter_pred<server_queue::cleanup_pending_task(int)::_lambda(server_task_const&)_1_>>
            (&local_50,&local_98,&local_b8,
             (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_examples_server_server_cpp:1696:24)>
              )id_target);
  local_b8._M_cur =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_b8._M_node =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_node;
  local_98._M_cur = local_50._M_cur;
  local_98._M_first = *local_50._M_node;
  local_98._M_last = local_98._M_first + 1;
  local_98._M_node = local_50._M_node;
  local_b8._M_first = *local_b8._M_node;
  local_b8._M_last = local_b8._M_first + 1;
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::_M_erase
            (&local_70,&this->queue_tasks_deferred,&local_98,&local_b8);
  return;
}

Assistant:

void cleanup_pending_task(int id_target) {
        // no need lock because this is called exclusively by post()
        auto rm_func = [id_target](const server_task & task) {
            return task.id_target == id_target;
        };
        queue_tasks.erase(
            std::remove_if(queue_tasks.begin(),          queue_tasks.end(),          rm_func),
            queue_tasks.end());
        queue_tasks_deferred.erase(
            std::remove_if(queue_tasks_deferred.begin(), queue_tasks_deferred.end(), rm_func),
            queue_tasks_deferred.end());
    }